

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O1

void __thiscall Gym_Emu::play_frame(Gym_Emu *this)

{
  sample_t_conflict1 *in_RCX;
  int in_EDX;
  blip_time_t in_ESI;
  
  play_frame((Gym_Emu *)(this[-1].dac_buf + 0x260),in_ESI,in_EDX,in_RCX);
  return;
}

Assistant:

int Gym_Emu::play_frame( blip_time_t blip_time, int sample_count, sample_t* buf )
{
	if ( !track_ended() )
		parse_frame();
	
	apu.end_frame( blip_time );
	
	memset( buf, 0, sample_count * sizeof *buf );
	fm.run( sample_count >> 1, buf );
	
	return sample_count;
}